

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O2

ItemSource * __thiscall RandomizerWorld::item_source(RandomizerWorld *this,string *name)

{
  pointer ppIVar1;
  ItemSource *pIVar2;
  __type _Var3;
  out_of_range *this_00;
  pointer ppIVar4;
  
  ppIVar4 = (this->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar4 == ppIVar1) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"No source with given name");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    pIVar2 = *ppIVar4;
    _Var3 = std::operator==(&pIVar2->_name,name);
    ppIVar4 = ppIVar4 + 1;
  } while (!_Var3);
  return pIVar2;
}

Assistant:

ItemSource* RandomizerWorld::item_source(const std::string& name) const
{
    for (ItemSource* source : _item_sources)
        if (source->name() == name)
            return source;

    throw std::out_of_range("No source with given name");
}